

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O2

void toml::detail::skip_value<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  char_type_conflict cVar2;
  undefined4 uVar3;
  location *ctx_00;
  result<toml::value_t,_toml::error_info> local_80;
  
  ctx_00 = loc;
  guess_value_type<toml::type_config>(&local_80,loc,ctx);
  uVar3 = 0;
  if (local_80.is_ok_ != false) {
    uVar3 = local_80.field_1._0_4_;
  }
  result<toml::value_t,_toml::error_info>::cleanup(&local_80,(EVP_PKEY_CTX *)ctx_00);
  if ((char)uVar3 == '\x04') {
    skip_string_like<toml::type_config>(loc,ctx);
  }
  else if ((uVar3 & 0xff) == 9) {
    skip_array_like<toml::type_config>(loc,ctx);
  }
  else if ((uVar3 & 0xff) == 10) {
    skip_inline_table_like<toml::type_config>(loc,ctx);
  }
  else {
    while ((((peVar1 = (loc->source_).
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,
             loc->location_ <
             (ulong)((long)(peVar1->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_start) &&
             (cVar2 = location::current(loc), cVar2 != '\n')) &&
            (cVar2 = location::current(loc), cVar2 != ',')) &&
           ((cVar2 = location::current(loc), cVar2 != ']' &&
            (cVar2 = location::current(loc), cVar2 != '}'))))) {
      location::advance(loc,1);
    }
  }
  return;
}

Assistant:

void skip_value(location& loc, const context<TC>& ctx)
{
    value_t ty = guess_value_type(loc, ctx).unwrap_or(value_t::empty);
    if(ty == value_t::string)
    {
        skip_string_like(loc, ctx);
    }
    else if(ty == value_t::array)
    {
        skip_array_like(loc, ctx);
    }
    else if(ty == value_t::table)
    {
        // In case of multiline tables, it may skip key-value pair but not the
        // whole table.
        skip_inline_table_like(loc, ctx);
    }
    else // others are an "in-line" values. skip until the next line
    {
        while( ! loc.eof())
        {
            if(loc.current() == '\n')
            {
                break;
            }
            else if(loc.current() == ',' || loc.current() == ']' || loc.current() == '}')
            {
                break;
            }
            loc.advance();
        }
    }
    return;
}